

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O3

void __thiscall cmsys::Directory::~Directory(Directory *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DirectoryInternals *this_00;
  pointer pcVar2;
  
  this_00 = this->Internal;
  if (this_00 != (DirectoryInternals *)0x0) {
    pcVar2 = (this_00->Path)._M_dataplus._M_p;
    paVar1 = &(this_00->Path).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&this_00->Files);
  }
  operator_delete(this_00,0x38);
  return;
}

Assistant:

Directory::~Directory()
{
  delete this->Internal;
}